

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O1

string * XMLIDEncode(string *__return_storage_ptr__,string *name)

{
  char cVar1;
  pointer pcVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  uint __c;
  char XML_ID_CHARS [66];
  stringstream idEncoded;
  char local_211;
  string *local_210;
  char local_208 [64];
  undefined2 local_1c8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar5 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz_-.";
  pcVar3 = local_208;
  for (lVar4 = 8; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)pcVar3 = *(undefined8 *)pcVar5;
    pcVar5 = pcVar5 + 8;
    pcVar3 = pcVar3 + 8;
  }
  local_1c8 = 0x2e;
  if (name->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar2,pcVar2);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b8);
    if (0x39 < (byte)(*(name->_M_dataplus)._M_p + 0xbfU)) {
      local_211 = '_';
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_211,1);
    }
    local_210 = __return_storage_ptr__;
    if (name->_M_string_length != 0) {
      pcVar5 = (name->_M_dataplus)._M_p;
      do {
        cVar1 = *pcVar5;
        __c = (uint)cVar1;
        pcVar3 = strchr(local_208,__c);
        if (pcVar3 == (char *)0x0) {
          local_211 = local_208[__c - ((__c / 0x42) * 0x40 + (__c / 0x42) * 2)];
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_211,1);
        }
        else {
          local_211 = cVar1;
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_211,1);
        }
        pcVar5 = pcVar5 + 1;
      } while (pcVar5 != (name->_M_dataplus)._M_p + name->_M_string_length);
    }
    __return_storage_ptr__ = local_210;
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return __return_storage_ptr__;
}

Assistant:

static const std::string XMLIDEncode(const std::string& name) {
    const char XML_ID_CHARS[] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz_-.";
    const unsigned int XML_ID_CHARS_COUNT = sizeof(XML_ID_CHARS) / sizeof(char);

    if (name.length() == 0) {
        return name;
    }

    std::stringstream idEncoded;

    // xsd:ID must start with letter or underscore
    if (!((name[0] >= 'A' && name[0] <= 'z') || name[0] == '_')) {
        idEncoded << '_';
    }

    for (std::string::const_iterator it = name.begin(); it != name.end(); ++it) {
        // xsd:ID can only contain letters, digits, underscores, hyphens and periods
        if (strchr(XML_ID_CHARS, *it) != nullptr) {
            idEncoded << *it;
        } else {
            // Select placeholder character based on invalid character to prevent name collisions 
            idEncoded << XML_ID_CHARS[(*it) % XML_ID_CHARS_COUNT];
        }
    }

    return idEncoded.str();
}